

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O1

UINT8 __thiscall S98Player::GetSongInfo(S98Player *this,PLR_SONG_INFO *songInf)

{
  UINT32 UVar1;
  
  if (this->_dLoad != (DATA_LOADER *)0x0) {
    songInf->format = 0x53393800;
    songInf->fileVerMaj = (ushort)(this->_fileHdr).fileVer;
    songInf->fileVerMin = 0;
    songInf->tickRateMul = (this->_fileHdr).tickMult;
    songInf->tickRateDiv = (this->_fileHdr).tickDiv;
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1c])();
    songInf->songLen = UVar1;
    if ((this->_fileHdr).loopOfs == 0) {
      UVar1 = 0xffffffff;
    }
    else {
      UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])(this);
    }
    songInf->loopTick = UVar1;
    songInf->volGain = 0x10000;
    songInf->deviceCnt =
         (UINT32)((ulong)((long)(this->_devHdrs).
                                super__Vector_base<S98_DEVICE,_std::allocator<S98_DEVICE>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->_devHdrs).
                               super__Vector_base<S98_DEVICE,_std::allocator<S98_DEVICE>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 4);
    return '\0';
  }
  return 0xff;
}

Assistant:

UINT8 S98Player::GetSongInfo(PLR_SONG_INFO& songInf)
{
	if (_dLoad == NULL)
		return 0xFF;
	
	songInf.format = FCC_S98;
	songInf.fileVerMaj = _fileHdr.fileVer;
	songInf.fileVerMin = 0x00;
	songInf.tickRateMul = _fileHdr.tickMult;
	songInf.tickRateDiv = _fileHdr.tickDiv;
	songInf.songLen = GetTotalTicks();
	songInf.loopTick = _fileHdr.loopOfs ? GetLoopTicks() : (UINT32)-1;
	songInf.volGain = 0x10000;
	songInf.deviceCnt = (UINT32)_devHdrs.size();
	
	return 0x00;
}